

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTreeViewItem>::insert
          (QMovableArrayOps<QTreeViewItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  QTreeViewItem *pQVar2;
  void *in_RCX;
  QArrayDataPointer<QTreeViewItem> *in_RDX;
  long in_RSI;
  QArrayDataPointer<QTreeViewItem> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  QTreeViewItem copy;
  qsizetype in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  QArrayDataPointer<QTreeViewItem> *pQVar6;
  Inserter local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_30,0xaa,0x28);
  memcpy(local_30,in_RCX,0x28);
  bVar3 = in_RDI->size != 0;
  uVar4 = bVar3 && in_RSI == 0;
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffff84);
  uVar1 = (uint)(bVar3 && in_RSI == 0);
  QArrayDataPointer<QTreeViewItem>::detachAndGrow
            (in_RDX,(GrowthPosition)((ulong)in_RCX >> 0x20),CONCAT44(uVar5,uVar1),
             (QTreeViewItem **)CONCAT17(uVar4,in_stack_ffffffffffffff78),in_RDI);
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(uVar5,uVar1),
                       (QArrayDataPointer<QTreeViewItem> *)CONCAT17(uVar4,in_stack_ffffffffffffff78)
                       ,(qsizetype)in_RDI,in_stack_ffffffffffffff68);
    Inserter::insertFill
              ((Inserter *)CONCAT44(uVar5,uVar1),
               (QTreeViewItem *)CONCAT17(uVar4,in_stack_ffffffffffffff78),(qsizetype)in_RDI);
    Inserter::~Inserter(&local_58);
  }
  else {
    while (pQVar6 = (QArrayDataPointer<QTreeViewItem> *)((long)&in_RDX[-1].size + 7),
          in_RDX != (QArrayDataPointer<QTreeViewItem> *)0x0) {
      pQVar2 = QArrayDataPointer<QTreeViewItem>::begin((QArrayDataPointer<QTreeViewItem> *)0x90bbb5)
      ;
      memcpy(pQVar2 + -1,local_30,0x28);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      in_RDX = pQVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }